

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

Type * __thiscall
JsUtil::
List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
::AllocArray(List<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *this,int size)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Type *pTVar16;
  bool *pbVar17;
  size_t byteSize;
  ulong uVar18;
  undefined4 uVar19;
  undefined4 uVar21;
  undefined1 auVar20 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar24 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar28 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  long lVar32;
  undefined1 auVar33 [16];
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar43 [16];
  
  if (size == 0) {
    pTVar16 = (Type *)&DAT_00000008;
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)size;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar2 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar2 * ZEXT816(0x18),0);
    }
    uVar18 = 0;
    pTVar16 = (Type *)new__<Memory::JitArenaAllocator>
                                (byteSize,(this->
                                          super_ReadOnlyList<JsUtil::Pair<unsigned_int,_IR::LabelInstr_*,_DefaultComparer>,_Memory::JitArenaAllocator,_DefaultComparer>
                                          ).alloc,0x3eba5c);
    auVar2 = _DAT_00fa8550;
    uVar1 = (long)size * 0x18 - 0x18;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar1;
    uVar19 = SUB164(auVar22 * ZEXT816(0xaaaaaaaaaaaaaaab),8);
    uVar21 = (undefined4)(uVar1 / 0x180000000);
    auVar23._0_8_ = CONCAT44(uVar21,uVar19);
    auVar23._8_4_ = uVar19;
    auVar23._12_4_ = uVar21;
    auVar20._0_8_ = auVar23._0_8_ >> 4;
    auVar20._8_8_ = auVar23._8_8_ >> 4;
    pbVar17 = &pTVar16->initialized;
    auVar22 = pmovsxbq(in_XMM1,0xf0e);
    auVar23 = pmovsxbq(in_XMM2,0xd0c);
    auVar24 = pmovsxbq(in_XMM3,0xb0a);
    auVar25 = pmovsxbq(in_XMM4,0x908);
    auVar26 = pmovsxbq(in_XMM5,0x706);
    auVar27 = pmovsxbq(in_XMM6,0x504);
    auVar28 = pmovsxbq(in_XMM7,0x302);
    auVar29 = pmovsxbq(in_XMM8,0x100);
    do {
      auVar30._8_4_ = (int)uVar18;
      auVar30._0_8_ = uVar18;
      auVar30._12_4_ = (int)(uVar18 >> 0x20);
      auVar33 = auVar20 | auVar2;
      auVar35 = (auVar30 | auVar29) ^ auVar2;
      lVar32 = auVar33._0_8_;
      auVar36._0_8_ = -(ulong)(lVar32 < auVar35._0_8_);
      lVar34 = auVar33._8_8_;
      auVar36._8_8_ = -(ulong)(lVar34 < auVar35._8_8_);
      auVar43 = pshuflw(in_XMM14,auVar36,0xe8);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar43 ^ auVar35,auVar43 ^ auVar35);
      if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *pbVar17 = false;
      }
      auVar36 = packssdw(auVar36,auVar36);
      auVar43._8_4_ = 0xffffffff;
      auVar43._0_8_ = 0xffffffffffffffff;
      auVar43._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar43,auVar36 ^ auVar43);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pbVar17[0x18] = false;
      }
      auVar36 = (auVar30 | auVar28) ^ auVar2;
      auVar37._0_8_ = -(ulong)(lVar32 < auVar36._0_8_);
      auVar37._8_8_ = -(ulong)(lVar34 < auVar36._8_8_);
      auVar35 = packssdw(auVar35,auVar37);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar3,auVar35 ^ auVar3);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar17[0x30] = false;
      }
      auVar36 = pshufhw(auVar37,auVar37,0x84);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar4,auVar36 ^ auVar4);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pbVar17[0x48] = false;
      }
      auVar36 = (auVar30 | auVar27) ^ auVar2;
      auVar38._0_8_ = -(ulong)(lVar32 < auVar36._0_8_);
      auVar38._8_8_ = -(ulong)(lVar34 < auVar36._8_8_);
      auVar35 = pshuflw(auVar35,auVar38,0xe8);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar5,auVar35 ^ auVar5);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar17[0x60] = false;
      }
      auVar36 = packssdw(auVar38,auVar38);
      auVar6._8_4_ = 0xffffffff;
      auVar6._0_8_ = 0xffffffffffffffff;
      auVar6._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar6,auVar36 ^ auVar6);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pbVar17[0x78] = false;
      }
      auVar36 = (auVar30 | auVar26) ^ auVar2;
      auVar39._0_8_ = -(ulong)(lVar32 < auVar36._0_8_);
      auVar39._8_8_ = -(ulong)(lVar34 < auVar36._8_8_);
      auVar35 = packssdw(auVar35,auVar39);
      auVar7._8_4_ = 0xffffffff;
      auVar7._0_8_ = 0xffffffffffffffff;
      auVar7._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar7,auVar35 ^ auVar7);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar17[0x90] = false;
      }
      auVar36 = pshufhw(auVar39,auVar39,0x84);
      auVar8._8_4_ = 0xffffffff;
      auVar8._0_8_ = 0xffffffffffffffff;
      auVar8._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar8,auVar36 ^ auVar8);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pbVar17[0xa8] = false;
      }
      auVar36 = (auVar30 | auVar25) ^ auVar2;
      auVar40._0_8_ = -(ulong)(lVar32 < auVar36._0_8_);
      auVar40._8_8_ = -(ulong)(lVar34 < auVar36._8_8_);
      auVar35 = pshuflw(auVar35,auVar40,0xe8);
      auVar9._8_4_ = 0xffffffff;
      auVar9._0_8_ = 0xffffffffffffffff;
      auVar9._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar9,auVar35 ^ auVar9);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pbVar17[0xc0] = false;
      }
      auVar36 = packssdw(auVar40,auVar40);
      auVar10._8_4_ = 0xffffffff;
      auVar10._0_8_ = 0xffffffffffffffff;
      auVar10._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar10,auVar36 ^ auVar10);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
        pbVar17[0xd8] = false;
      }
      auVar36 = (auVar30 | auVar24) ^ auVar2;
      auVar41._0_8_ = -(ulong)(lVar32 < auVar36._0_8_);
      auVar41._8_8_ = -(ulong)(lVar34 < auVar36._8_8_);
      auVar35 = packssdw(auVar35,auVar41);
      auVar11._8_4_ = 0xffffffff;
      auVar11._0_8_ = 0xffffffffffffffff;
      auVar11._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar11,auVar35 ^ auVar11);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        pbVar17[0xf0] = false;
      }
      auVar36 = pshufhw(auVar41,auVar41,0x84);
      auVar12._8_4_ = 0xffffffff;
      auVar12._0_8_ = 0xffffffffffffffff;
      auVar12._12_4_ = 0xffffffff;
      auVar36 = packssdw(auVar36 ^ auVar12,auVar36 ^ auVar12);
      auVar36 = packsswb(auVar36,auVar36);
      if ((auVar36 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
        pbVar17[0x108] = false;
      }
      auVar36 = (auVar30 | auVar23) ^ auVar2;
      auVar42._0_8_ = -(ulong)(lVar32 < auVar36._0_8_);
      auVar42._8_8_ = -(ulong)(lVar34 < auVar36._8_8_);
      auVar35 = pshuflw(auVar35,auVar42,0xe8);
      auVar13._8_4_ = 0xffffffff;
      auVar13._0_8_ = 0xffffffffffffffff;
      auVar13._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar13,auVar35 ^ auVar13);
      in_XMM14 = packsswb(auVar35,auVar35);
      if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        pbVar17[0x120] = false;
      }
      auVar35 = packssdw(auVar42,auVar42);
      auVar14._8_4_ = 0xffffffff;
      auVar14._0_8_ = 0xffffffffffffffff;
      auVar14._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar14,auVar35 ^ auVar14);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
        pbVar17[0x138] = false;
      }
      auVar35 = (auVar30 | auVar22) ^ auVar2;
      auVar31._0_8_ = -(ulong)(lVar32 < auVar35._0_8_);
      auVar31._8_8_ = -(ulong)(lVar34 < auVar35._8_8_);
      auVar35 = packssdw(auVar33,auVar31);
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar33,auVar35 ^ auVar33);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        pbVar17[0x150] = false;
      }
      auVar35 = pshufhw(auVar31,auVar31,0x84);
      auVar15._8_4_ = 0xffffffff;
      auVar15._0_8_ = 0xffffffffffffffff;
      auVar15._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar15,auVar35 ^ auVar15);
      auVar35 = packsswb(auVar35,auVar35);
      if ((auVar35 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
        pbVar17[0x168] = false;
      }
      uVar18 = uVar18 + 0x10;
      pbVar17 = pbVar17 + 0x180;
    } while ((uVar1 / 0x18 + 0x10 & 0xfffffffffffffff0) != uVar18);
  }
  return pTVar16;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}